

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Node * PruneSection(TidyDocImpl *doc,Node *node)

{
  Lexer *lexer;
  int iVar1;
  Node *check;
  Node *pNVar2;
  
  lexer = doc->lexer;
  do {
    iVar1 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"if !supportEmptyParas",0x15);
    pNVar2 = node;
    if (iVar1 == 0) {
      for (; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->parent) {
        if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_TD)) {
          pNVar2 = prvTidyNewLiteralTextNode(lexer,anon_var_dwarf_22edb);
          prvTidyInsertNodeBeforeElement(node,pNVar2);
          break;
        }
      }
    }
    if (node->type == TextNode) {
      node = node->next;
    }
    else {
      node = prvTidyDiscardElement(doc,node);
    }
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (node->type == SectionTag) {
      iVar1 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"if",2);
      if (iVar1 == 0) {
        node = PruneSection(doc,node);
      }
      else {
        iVar1 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"endif",5);
        if (iVar1 == 0) {
          pNVar2 = prvTidyDiscardElement(doc,node);
          return pNVar2;
        }
      }
    }
  } while( true );
}

Assistant:

static Node* PruneSection( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    for (;;)
    {
        ctmbstr lexbuf = lexer->lexbuf + node->start;
        if ( TY_(tmbstrncmp)(lexbuf, "if !supportEmptyParas", 21) == 0 )
        {
          Node* cell = FindEnclosingCell( doc, node );
          if ( cell )
          {
            /* Need to put &nbsp; into cell so it doesn't look weird
            */
            Node* nbsp = TY_(NewLiteralTextNode)( lexer, "\240" );
            assert( (byte)'\240' == (byte)160 );
            TY_(InsertNodeBeforeElement)( node, nbsp );
          }
        }

        /* discard node and returns next, unless it is a text node */
        if ( node->type == TextNode )
            node = node->next;
        else
            node = TY_(DiscardElement)( doc, node );

        if (node == NULL)
            return NULL;
        
        if (node->type == SectionTag)
        {
            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0)
            {
                node = PruneSection( doc, node );
                continue;
            }

            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "endif", 5) == 0)
            {
                node = TY_(DiscardElement)( doc, node );
                break;
            }
        }
    }

    return node;
}